

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O2

bool __thiscall dg::llvmdg::legacy::Block::removePredecessor(Block *this,Block *predecessor)

{
  size_type sVar1;
  bool bVar2;
  Block *local_20;
  Block *local_18;
  
  if (predecessor == (Block *)0x0) {
    bVar2 = false;
  }
  else {
    local_20 = predecessor;
    std::
    _Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
    ::erase(&(this->predecessors_)._M_t,&local_20);
    local_18 = this;
    sVar1 = std::
            _Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
            ::erase(&(local_20->successors_)._M_t,&local_18);
    bVar2 = sVar1 != 0;
  }
  return bVar2;
}

Assistant:

bool Block::removePredecessor(Block *predecessor) {
    if (!predecessor) {
        return false;
    }
    predecessors_.erase(predecessor);
    return predecessor->successors_.erase(this);
}